

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventFilter.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::filterEvents_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,Session *session,EventFilter *filter)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *entry;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  size_t sVar3;
  __shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  const_iterator __first;
  TestStream *__n;
  Queue *__n_00;
  long lVar5;
  long lVar6;
  void *pvVar7;
  shared_ptr<binlog::Session::Channel> *channelptr;
  const_iterator __last;
  long lVar8;
  bool bVar9;
  QueueReader reader;
  QueueReader local_b0;
  ReadResult local_a0;
  _anonymous_namespace_ *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  _anonymous_namespace_ *local_70;
  __shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> *local_68;
  FilterAdapter local_60;
  
  __n = &local_60.stream;
  local_60.stream.super_EntryStream._vptr_EntryStream = (_func_int **)&PTR__TestStream_001cfcc8;
  local_60.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.stream.readPos = 0;
  local_60.filter = (EventFilter *)session;
  std::mutex::lock((mutex *)this);
  local_78 = __return_storage_ptr__;
  if (this[0x8a] == (_anonymous_namespace_)0x1) {
    anon_unknown.dwarf_270e5e::FilterAdapter::write
              (&local_60,(int)*(long *)(this + 0x40) + 0x18,
               (void *)((*(long *)(this + 0x48) - *(long *)(this + 0x40)) + -0x18),(size_t)__n);
    lVar8 = (*(long *)(this + 0x48) - *(long *)(this + 0x40)) + -0x18;
    this[0x8a] = (_anonymous_namespace_)0x0;
  }
  else {
    lVar8 = 0;
  }
  __n_00 = *(Queue **)(this + 0x70);
  pvVar7 = (void *)(((*(long *)(this + 0x60) - (long)__n_00) - *(long *)(this + 0x58)) + -0x18);
  anon_unknown.dwarf_270e5e::FilterAdapter::write
            (&local_60,(int)__n_00 + (int)*(long *)(this + 0x58) + 0x18,pvVar7,(size_t)__n_00);
  *(long *)(this + 0x70) = *(long *)(this + 0x70) + (long)pvVar7;
  lVar8 = lVar8 + (long)pvVar7;
  local_80 = this + 0x28;
  local_68 = *(__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> **)(this + 0x30);
  local_70 = this + 0x90;
  lVar5 = lVar8;
  for (p_Var4 = *(__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> **)
                 (this + 0x28); p_Var4 != local_68; p_Var4 = p_Var4 + 1) {
    p_Var1 = (p_Var4->_M_refcount)._M_pi;
    if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar9 = false;
    }
    else {
      bVar9 = p_Var1->_M_use_count == 1;
    }
    entry = p_Var4->_M_ptr;
    local_b0._queue =
         (Queue *)((entry->_queue)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                   _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x10);
    local_b0._readEnd = 0;
    binlog::detail::QueueReader::beginRead(&local_a0,&local_b0);
    if (local_a0.size2 + local_a0.size1 != 0) {
      (entry->writerProp).batchSize = local_a0.size2 + local_a0.size1;
      if (*(long *)(this + 0x98) != *(long *)(this + 0x90)) {
        *(long *)(this + 0x98) = *(long *)(this + 0x90);
      }
      sVar3 = binlog::
              serializeSizePrefixedTagged<binlog::WriterProp,binlog::detail::VectorOutputStream>
                        (&entry->writerProp,(VectorOutputStream *)local_70);
      anon_unknown.dwarf_270e5e::FilterAdapter::write
                (&local_60,(int)*(long *)(this + 0x90),
                 (void *)(*(long *)(this + 0x98) - *(long *)(this + 0x90)),(size_t)__n_00);
      anon_unknown.dwarf_270e5e::FilterAdapter::write
                (&local_60,(int)local_a0.buffer1,(void *)local_a0.size1,(size_t)__n_00);
      if ((void *)local_a0.size2 == (void *)0x0) {
        pvVar7 = (void *)0x0;
      }
      else {
        anon_unknown.dwarf_270e5e::FilterAdapter::write
                  (&local_60,(int)local_a0.buffer2,(void *)local_a0.size2,(size_t)__n_00);
        pvVar7 = (void *)local_a0.size2;
      }
      ((local_b0._queue)->readIndex).super___atomic_base<unsigned_long>._M_i = local_b0._readEnd;
      lVar8 = sVar3 + lVar5 + (long)pvVar7 + local_a0.size1;
      __n_00 = local_b0._queue;
      lVar5 = lVar8;
    }
    if (bVar9) {
      std::__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>::reset(p_Var4);
    }
  }
  p_Var4 = *(__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> **)(this + 0x28);
  __last._M_current = *(shared_ptr<binlog::Session::Channel> **)(this + 0x30);
  lVar5 = (long)__last._M_current - (long)p_Var4;
  for (lVar6 = lVar5 >> 6; 0 < lVar6; lVar6 = lVar6 + -1) {
    __first._M_current = (shared_ptr<binlog::Session::Channel> *)p_Var4;
    if (p_Var4->_M_ptr == (element_type *)0x0) goto LAB_00180c40;
    if (p_Var4[1]._M_ptr == (element_type *)0x0) {
      __first._M_current = (shared_ptr<binlog::Session::Channel> *)(p_Var4 + 1);
      goto LAB_00180c40;
    }
    if (p_Var4[2]._M_ptr == (element_type *)0x0) {
      __first._M_current = (shared_ptr<binlog::Session::Channel> *)(p_Var4 + 2);
      goto LAB_00180c40;
    }
    if (p_Var4[3]._M_ptr == (element_type *)0x0) {
      __first._M_current = (shared_ptr<binlog::Session::Channel> *)(p_Var4 + 3);
      goto LAB_00180c40;
    }
    p_Var4 = p_Var4 + 4;
    lVar5 = lVar5 + -0x40;
  }
  lVar5 = lVar5 >> 4;
  if (lVar5 == 1) {
LAB_00180c26:
    __first._M_current = (shared_ptr<binlog::Session::Channel> *)p_Var4;
    if (p_Var4->_M_ptr != (element_type *)0x0) {
      __first._M_current = __last._M_current;
    }
  }
  else if (lVar5 == 2) {
LAB_00180c1c:
    __first._M_current = (shared_ptr<binlog::Session::Channel> *)p_Var4;
    if (p_Var4->_M_ptr != (element_type *)0x0) {
      p_Var4 = p_Var4 + 1;
      goto LAB_00180c26;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (lVar5 != 3) goto LAB_00180c7f;
    __first._M_current = (shared_ptr<binlog::Session::Channel> *)p_Var4;
    if (p_Var4->_M_ptr != (element_type *)0x0) {
      p_Var4 = p_Var4 + 1;
      goto LAB_00180c1c;
    }
  }
LAB_00180c40:
  p_Var4 = &(__first._M_current)->
            super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>;
  if (__first._M_current != __last._M_current) {
    while (__first._M_current =
                (shared_ptr<binlog::Session::Channel> *)
                (&(__first._M_current)->
                  super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> + 1),
          __first._M_current != __last._M_current) {
      if (((__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> *)__first._M_current)
          ->_M_ptr != (element_type *)0x0) {
        std::__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (p_Var4,(__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> *)
                          __first._M_current);
        p_Var4 = p_Var4 + 1;
      }
    }
    __last._M_current = *(shared_ptr<binlog::Session::Channel> **)(this + 0x30);
    __first._M_current = (shared_ptr<binlog::Session::Channel> *)p_Var4;
  }
LAB_00180c7f:
  std::
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ::erase((vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
           *)local_80,__first,__last);
  *(long *)(this + 0x80) = *(long *)(this + 0x80) + lVar8;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  pvVar2 = local_78;
  streamToEvents_abi_cxx11_(local_78,&local_60.stream,"%S %m");
  TestStream::~TestStream(&local_60.stream);
  return pvVar2;
}

Assistant:

std::vector<std::string> filterEvents(binlog::Session& session, binlog::EventFilter& filter)
{
  FilterAdapter adapter{filter, {}};
  session.consume(adapter);
  return streamToEvents(adapter.stream, "%S %m");
}